

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_fighterquietus.cpp
# Opt level: O2

int AF_A_FSwordAttack(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  AWeapon *this_00;
  bool bVar2;
  AActor *source;
  char *__assertion;
  FSoundID local_44;
  DAngle local_40;
  DAngle local_38;
  DAngle local_30;
  DAngle local_28;
  DAngle local_20;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_00539e13;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_00539e03;
  source = *(AActor **)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (source == (AActor *)0x0) goto LAB_00539bc3;
    bVar2 = DObject::IsKindOf((DObject *)source,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_00539e13;
    }
  }
  else {
    if (source != (AActor *)0x0) goto LAB_00539e03;
LAB_00539bc3:
    source = (AActor *)0x0;
  }
  if (numparam == 1) goto LAB_00539c43;
  VVar1 = param[1].field_0.field_3.Type;
  if (VVar1 != 0xff) {
    if (VVar1 != '\x03') {
LAB_00539e03:
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
      goto LAB_00539e13;
    }
    this = (DObject *)param[1].field_0.field_1.a;
    if (param[1].field_0.field_1.atag == 1) {
      if ((this != (DObject *)0x0) &&
         (bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass), !bVar2)) {
        __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_00539e13;
      }
    }
    else if (this != (DObject *)0x0) goto LAB_00539e03;
  }
  if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
     ((VVar1 == '\x03' &&
      ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_00539c43:
    if (source->player != (player_t *)0x0) {
      this_00 = source->player->ReadyWeapon;
      if ((this_00 != (AWeapon *)0x0) &&
         (bVar2 = AWeapon::DepleteAmmo(this_00,this_00->bAltFire,true,-1), !bVar2)) {
        return 0;
      }
      local_20.Degrees = (source->Angles).Yaw.Degrees + 11.25;
      P_SpawnPlayerMissile
                (source,0.0,0.0,-10.0,(PClassActor *)AFSwordMissile::RegistrationInfo.MyClass,
                 &local_20,(FTranslatedLineTarget *)0x0,(AActor **)0x0,false,false,0);
      local_28.Degrees = (source->Angles).Yaw.Degrees + 5.625;
      P_SpawnPlayerMissile
                (source,0.0,0.0,-5.0,(PClassActor *)AFSwordMissile::RegistrationInfo.MyClass,
                 &local_28,(FTranslatedLineTarget *)0x0,(AActor **)0x0,false,false,0);
      local_30.Degrees = (source->Angles).Yaw.Degrees;
      P_SpawnPlayerMissile
                (source,0.0,0.0,0.0,(PClassActor *)AFSwordMissile::RegistrationInfo.MyClass,
                 &local_30,(FTranslatedLineTarget *)0x0,(AActor **)0x0,false,false,0);
      local_38.Degrees = (source->Angles).Yaw.Degrees + -5.625;
      P_SpawnPlayerMissile
                (source,0.0,0.0,5.0,(PClassActor *)AFSwordMissile::RegistrationInfo.MyClass,
                 &local_38,(FTranslatedLineTarget *)0x0,(AActor **)0x0,false,false,0);
      local_40.Degrees = (source->Angles).Yaw.Degrees + -11.25;
      P_SpawnPlayerMissile
                (source,0.0,0.0,10.0,(PClassActor *)AFSwordMissile::RegistrationInfo.MyClass,
                 &local_40,(FTranslatedLineTarget *)0x0,(AActor **)0x0,false,false,0);
      local_44.ID = S_FindSound("FighterSwordFire");
      S_Sound(source,1,&local_44,1.0,1.0);
    }
    return 0;
  }
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
  ;
LAB_00539e13:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighterquietus.cpp"
                ,0x51,"int AF_A_FSwordAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FSwordAttack)
{
	PARAM_ACTION_PROLOGUE;

	player_t *player;

	if (NULL == (player = self->player))
	{
		return 0;
	}
	AWeapon *weapon = self->player->ReadyWeapon;
	if (weapon != NULL)
	{
		if (!weapon->DepleteAmmo (weapon->bAltFire))
			return 0;
	}
	P_SpawnPlayerMissile (self, 0, 0, -10, RUNTIME_CLASS(AFSwordMissile), self->Angles.Yaw + (45./4));
	P_SpawnPlayerMissile (self, 0, 0,  -5, RUNTIME_CLASS(AFSwordMissile), self->Angles.Yaw + (45./8));
	P_SpawnPlayerMissile (self, 0, 0,   0, RUNTIME_CLASS(AFSwordMissile),  self->Angles.Yaw);
	P_SpawnPlayerMissile (self, 0, 0,   5, RUNTIME_CLASS(AFSwordMissile), self->Angles.Yaw - (45./8));
	P_SpawnPlayerMissile (self, 0, 0,  10, RUNTIME_CLASS(AFSwordMissile), self->Angles.Yaw - (45./4));
	S_Sound (self, CHAN_WEAPON, "FighterSwordFire", 1, ATTN_NORM);
	return 0;
}